

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSize.cpp
# Opt level: O2

void testSize(void)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"size and alignment\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"sizeof  (half) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"alignof (half) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"ok\n\n");
  std::ostream::flush();
  return;
}

Assistant:

void
testSize ()
{
    cout << "size and alignment\n";

    half h[2];

    int size = sizeof (half);
    ptrdiff_t algn = (char *)&h[1] - (char *)&h[0];

    cout << "sizeof  (half) = " << size << endl;
    cout << "alignof (half) = " << (int) algn << endl;

    assert (size == 2 && algn == 2);

    cout << "ok\n\n" << flush;
}